

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderSorter.cpp
# Opt level: O3

void sortHeaders(vector<Header,_std::allocator<Header>_> *headers)

{
  ushort uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  uint uVar4;
  __hash_code __code;
  ulong uVar5;
  Header *__a;
  pointer pHVar6;
  long lVar7;
  pointer pHVar8;
  ulong uVar9;
  ulong uVar10;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_70;
  uint local_34;
  
  local_70._M_buckets = &local_70._M_single_bucket;
  local_70._M_bucket_count = 1;
  local_70._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_70._M_element_count = 0;
  local_70._M_rehash_policy._M_max_load_factor = 1.0;
  local_70._M_rehash_policy._M_next_resize = 0;
  local_70._M_single_bucket = (__node_base_ptr)0x0;
  pHVar6 = (headers->super__Vector_base<Header,_std::allocator<Header>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pHVar8 = (headers->super__Vector_base<Header,_std::allocator<Header>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pHVar6 == pHVar8) {
LAB_00107620:
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_70);
    return;
  }
LAB_001074dd:
  local_70._M_buckets = &local_70._M_single_bucket;
  local_70._M_single_bucket = (__node_base_ptr)0x0;
  local_70._M_rehash_policy._M_next_resize = 0;
  local_70._M_rehash_policy._M_max_load_factor = 1.0;
  local_70._M_element_count = 0;
  local_70._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_70._M_bucket_count = 1;
  uVar9 = 0;
  do {
    local_34 = (uint)pHVar6->m_id;
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_emplace<unsigned_int>(&local_70,&local_34);
    for (p_Var2 = (pHVar6->m_dependancies)._M_h._M_before_begin._M_nxt;
        p_Var2 != (_Hash_node_base *)0x0; p_Var2 = p_Var2->_M_nxt) {
      uVar1 = *(ushort *)&p_Var2[1]._M_nxt;
      if (local_70._M_buckets[(ulong)uVar1 % local_70._M_bucket_count & 0xffffffff] ==
          (__node_base_ptr)0x0) {
LAB_0010756a:
        pHVar6 = (headers->super__Vector_base<Header,_std::allocator<Header>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = ((long)(headers->super__Vector_base<Header,_std::allocator<Header>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pHVar6 >> 4) * 0x2e8ba2e8ba2e8ba3;
        uVar10 = uVar9;
        uVar4 = 0xffffffff;
        if (uVar5 < uVar9 || uVar5 - uVar9 == 0) goto LAB_001075b9;
        goto LAB_00107599;
      }
      p_Var3 = local_70._M_buckets[(ulong)uVar1 % local_70._M_bucket_count & 0xffffffff]->_M_nxt;
      uVar4 = *(uint *)&p_Var3[1]._M_nxt;
      while (uVar4 != uVar1) {
        p_Var3 = p_Var3->_M_nxt;
        if ((p_Var3 == (_Hash_node_base *)0x0) ||
           (uVar4 = *(uint *)&p_Var3[1]._M_nxt,
           (ulong)uVar4 % local_70._M_bucket_count != (ulong)uVar1 % local_70._M_bucket_count))
        goto LAB_0010756a;
      }
    }
    uVar9 = (ulong)((uint)uVar9 + 1);
    pHVar6 = pHVar6 + 1;
  } while (pHVar6 != pHVar8);
  goto LAB_00107620;
  while (uVar10 = (ulong)((uint)uVar10 + 1), uVar4 = 0xffffffff,
        uVar10 <= uVar5 && uVar5 - uVar10 != 0) {
LAB_00107599:
    uVar4 = (uint)uVar10;
    if (pHVar6[uVar10].m_id == uVar1) break;
  }
LAB_001075b9:
  if ((uint)uVar9 < uVar4) {
    uVar10 = (ulong)uVar4;
    lVar7 = uVar10 * 0xb0;
    do {
      __a = (Header *)
            ((long)&(((headers->super__Vector_base<Header,_std::allocator<Header>_>)._M_impl.
                      super__Vector_impl_data._M_start)->m_fileContents)._M_dataplus._M_p + lVar7);
      uVar10 = uVar10 - 1;
      std::swap<Header>(__a,__a + -1);
      lVar7 = lVar7 + -0xb0;
    } while (uVar9 < uVar10);
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_70);
  local_70._M_buckets = &local_70._M_single_bucket;
  local_70._M_bucket_count = 1;
  local_70._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_70._M_element_count = 0;
  local_70._M_rehash_policy._M_max_load_factor = 1.0;
  local_70._M_rehash_policy._M_next_resize = 0;
  local_70._M_single_bucket = (__node_base_ptr)0x0;
  pHVar6 = (headers->super__Vector_base<Header,_std::allocator<Header>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pHVar8 = (headers->super__Vector_base<Header,_std::allocator<Header>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pHVar6 == pHVar8) goto LAB_00107620;
  goto LAB_001074dd;
}

Assistant:

void sortHeaders(std::vector<Header>& headers)
{
    /*
    std::vector<Header> sortedHeaders;

    for (auto& header : headers) {
        bool hasDependancy = false;
        std::cout << "ITR\n";
        for (int i = 0; i < sortedHeaders.size(); i++) {
            auto& d = header.getDependancies();
            if (d.find(sortedHeaders[i].getID()) != d.end()) {
                sortedHeaders.insert(sortedHeaders.begin(), header);
                hasDependancy = true;
                break;
            }
        }
        if (!hasDependancy) {
            sortedHeaders.push_back(header);
        }
    }

    headers = sortedHeaders;
    */
   while (!isSorted(headers));
}